

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KcpConnection.cpp
# Opt level: O0

void __thiscall sznet::net::KcpConnection::forceClose(KcpConnection *this)

{
  EventLoop *this_00;
  enable_shared_from_this<sznet::net::KcpConnection> local_70;
  code *local_60;
  undefined8 local_58;
  type local_50;
  Functor local_30;
  KcpConnection *local_10;
  KcpConnection *this_local;
  
  if (((this->m_state == kConnected) || (this->m_state == kConnecting)) ||
     (this->m_state == kDelayDisconnecting)) {
    local_10 = this;
    setState(this,kDisconnecting);
    this_00 = this->m_loop;
    local_60 = forceCloseInLoop;
    local_58 = 0;
    std::enable_shared_from_this<sznet::net::KcpConnection>::shared_from_this(&local_70);
    std::bind<void(sznet::net::KcpConnection::*)(),std::shared_ptr<sznet::net::KcpConnection>>
              (&local_50,(offset_in_KcpConnection_to_subr *)&local_60,
               (shared_ptr<sznet::net::KcpConnection> *)&local_70);
    std::function<void()>::
    function<std::_Bind<void(sznet::net::KcpConnection::*(std::shared_ptr<sznet::net::KcpConnection>))()>,void>
              ((function<void()> *)&local_30,&local_50);
    EventLoop::queueInLoop(this_00,&local_30);
    std::function<void_()>::~function(&local_30);
    std::_Bind<void_(sznet::net::KcpConnection::*(std::shared_ptr<sznet::net::KcpConnection>))()>::
    ~_Bind(&local_50);
    std::shared_ptr<sznet::net::KcpConnection>::~shared_ptr
              ((shared_ptr<sznet::net::KcpConnection> *)&local_70);
  }
  return;
}

Assistant:

void KcpConnection::forceClose()
{
	// FIXME: use compare and swap
	if (m_state == kConnected || m_state == kConnecting || m_state == kDelayDisconnecting)
	{
		setState(kDisconnecting);
		m_loop->queueInLoop(std::bind(&KcpConnection::forceCloseInLoop, shared_from_this()));
	}
}